

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O3

string * google::protobuf::compiler::java::EscapeJavadoc
                   (string *__return_storage_ptr__,string *input)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (input->_M_string_length != 0) {
    uVar3 = 0;
    bVar2 = 0x2a;
    do {
      bVar1 = (input->_M_dataplus)._M_p[uVar3];
      if (bVar1 < 0x3c) {
        if (bVar1 != 0x26) {
          if (bVar1 == 0x2a) {
            if (bVar2 != 0x2f) goto LAB_002e992d;
          }
          else if ((bVar1 != 0x2f) || (bVar2 != 0x2a)) goto LAB_002e992d;
        }
LAB_002e9923:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if (0x3f < bVar1) {
          if ((bVar1 != 0x40) && (bVar1 != 0x5c)) goto LAB_002e992d;
          goto LAB_002e9923;
        }
        if ((bVar1 == 0x3c) || (bVar1 == 0x3e)) goto LAB_002e9923;
LAB_002e992d:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar3 = uVar3 + 1;
      bVar2 = bVar1;
    } while (uVar3 < input->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EscapeJavadoc(const std::string& input) {
  std::string result;
  result.reserve(input.size() * 2);

  char prev = '*';

  for (std::string::size_type i = 0; i < input.size(); i++) {
    char c = input[i];
    switch (c) {
      case '*':
        // Avoid "/*".
        if (prev == '/') {
          result.append("&#42;");
        } else {
          result.push_back(c);
        }
        break;
      case '/':
        // Avoid "*/".
        if (prev == '*') {
          result.append("&#47;");
        } else {
          result.push_back(c);
        }
        break;
      case '@':
        // '@' starts javadoc tags including the @deprecated tag, which will
        // cause a compile-time error if inserted before a declaration that
        // does not have a corresponding @Deprecated annotation.
        result.append("&#64;");
        break;
      case '<':
        // Avoid interpretation as HTML.
        result.append("&lt;");
        break;
      case '>':
        // Avoid interpretation as HTML.
        result.append("&gt;");
        break;
      case '&':
        // Avoid interpretation as HTML.
        result.append("&amp;");
        break;
      case '\\':
        // Java interprets Unicode escape sequences anywhere!
        result.append("&#92;");
        break;
      default:
        result.push_back(c);
        break;
    }

    prev = c;
  }

  return result;
}